

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_parser.tab.hh
# Opt level: O0

void __thiscall
MC::MC_Parser::basic_symbol<MC::MC_Parser::by_state>::clear
          (basic_symbol<MC::MC_Parser::by_state> *this)

{
  symbol_kind_type sVar1;
  basic_symbol<MC::MC_Parser::by_state> *yysym;
  symbol_kind_type yykind;
  basic_symbol<MC::MC_Parser::by_state> *this_local;
  
  sVar1 = by_state::kind(&this->super_by_state);
  if (sVar1 == S_WORD) {
LAB_00198bbc:
    value_type::destroy<std::__cxx11::string>(&this->value);
  }
  else {
    if (sVar1 != S_COMPARISON) {
      if ((uint)(sVar1 + ~S_COMPARISON) < 3) goto LAB_00198bbc;
      if (sVar1 != S_INTNUM) {
        if (sVar1 == S_BOOL) {
          value_type::destroy<bool>(&this->value);
          goto LAB_00198bcf;
        }
        if (sVar1 == S_APPROXNUM) {
          value_type::destroy<float>(&this->value);
          goto LAB_00198bcf;
        }
        if (sVar1 == S_USERVAR) goto LAB_00198bbc;
        if (((((1 < (uint)(sVar1 + ~S_opt_where)) && (sVar1 != S_table_references)) &&
             (1 < (uint)(sVar1 + ~S_delete_stmt))) &&
            ((sVar1 != S_insert_opts && (sVar1 != S_insert_vals_list)))) &&
           ((sVar1 != S_create_col_list &&
            ((3 < (uint)(sVar1 + ~S_280_1) && (sVar1 != S_data_type)))))) goto LAB_00198bcf;
      }
    }
    value_type::destroy<int>(&this->value);
  }
LAB_00198bcf:
  by_state::clear(&this->super_by_state);
  return;
}

Assistant:

void clear () YY_NOEXCEPT
      {
        // User destructor.
        symbol_kind_type yykind = this->kind ();
        basic_symbol<Base>& yysym = *this;
        (void) yysym;
        switch (yykind)
        {
       default:
          break;
        }

        // Value type destructor.
switch (yykind)
    {
      case symbol_kind::S_BOOL: // BOOL
        value.template destroy< bool > ();
        break;

      case symbol_kind::S_APPROXNUM: // APPROXNUM
        value.template destroy< float > ();
        break;

      case symbol_kind::S_COMPARISON: // COMPARISON
      case symbol_kind::S_INTNUM: // INTNUM
      case symbol_kind::S_column_list: // column_list
      case symbol_kind::S_select_expr_list: // select_expr_list
      case symbol_kind::S_table_references: // table_references
      case symbol_kind::S_delete_opts: // delete_opts
      case symbol_kind::S_delete_list: // delete_list
      case symbol_kind::S_insert_opts: // insert_opts
      case symbol_kind::S_insert_vals_list: // insert_vals_list
      case symbol_kind::S_create_col_list: // create_col_list
      case symbol_kind::S_column_atts: // column_atts
      case symbol_kind::S_opt_length: // opt_length
      case symbol_kind::S_opt_binary: // opt_binary
      case symbol_kind::S_opt_uz: // opt_uz
      case symbol_kind::S_data_type: // data_type
        value.template destroy< int > ();
        break;

      case symbol_kind::S_WORD: // WORD
      case symbol_kind::S_HLH: // HLH
      case symbol_kind::S_NAME: // NAME
      case symbol_kind::S_STRING: // STRING
      case symbol_kind::S_USERVAR: // USERVAR
        value.template destroy< std::string > ();
        break;

      default:
        break;
    }

        Base::clear ();
      }